

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint64_t helper_float_mulr_ps_mips(CPUMIPSState *env,uint64_t fdt0,uint64_t fdt1)

{
  float_status *s;
  byte bVar1;
  uint uVar2;
  float32 fVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar3 = float32_mul_mips((float32)fdt0,(float32)(fdt0 >> 0x20),s);
  fVar4 = float32_mul_mips((float32)fdt1,(float32)(fdt1 >> 0x20),s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar2 = (env->active_fpu).fcr31;
  uVar6 = uVar5 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar6;
  if (uVar5 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar5 & uVar2 >> 7) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar6 | uVar5 << 2;
  }
  return CONCAT44(fVar4,fVar3);
}

Assistant:

uint64_t helper_float_mulr_ps(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt1)
{
    uint32_t fst0 = fdt0 & 0XFFFFFFFF;
    uint32_t fsth0 = fdt0 >> 32;
    uint32_t fst1 = fdt1 & 0XFFFFFFFF;
    uint32_t fsth1 = fdt1 >> 32;
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = float32_mul(fst0, fsth0, &env->active_fpu.fp_status);
    fsth2 = float32_mul(fst1, fsth1, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}